

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

bool Diligent::VerifyResourceStates(RESOURCE_STATE State,bool IsTexture)

{
  Diligent *this;
  RESOURCE_STATE State_00;
  undefined8 in_RDX;
  undefined7 uVar1;
  char (*in_R8) [280];
  bool bVar2;
  bool bVar3;
  string _msg;
  string local_48;
  String local_28;
  
  this = (Diligent *)(ulong)State;
  bVar2 = (State >> 0x14 & 1) == 0;
  bVar3 = (State & ~RESOURCE_STATE_COMMON) == RESOURCE_STATE_UNKNOWN;
  uVar1 = (undefined7)((ulong)in_RDX >> 8);
  if (bVar3 || bVar2) {
    bVar2 = (State & RESOURCE_STATE_UNDEFINED) == RESOURCE_STATE_UNKNOWN;
    if (State < RESOURCE_STATE_VERTEX_BUFFER || bVar2) {
      bVar2 = (State & RESOURCE_STATE_UNORDERED_ACCESS) == RESOURCE_STATE_UNKNOWN;
      bVar3 = (State & ~RESOURCE_STATE_UNORDERED_ACCESS) == RESOURCE_STATE_UNKNOWN;
      if (bVar3 || bVar2) {
        bVar2 = (State & RESOURCE_STATE_RENDER_TARGET) == RESOURCE_STATE_UNKNOWN;
        bVar3 = (State & ~RESOURCE_STATE_RENDER_TARGET) == RESOURCE_STATE_UNKNOWN;
        if (bVar3 || bVar2) {
          bVar2 = (State & RESOURCE_STATE_DEPTH_WRITE) == RESOURCE_STATE_UNKNOWN;
          bVar3 = (State & ~RESOURCE_STATE_DEPTH_WRITE) == RESOURCE_STATE_UNKNOWN;
          if (bVar3 || bVar2) {
            bVar2 = (State >> 0xb & 1) == 0;
            bVar3 = (State & ~RESOURCE_STATE_COPY_DEST) == RESOURCE_STATE_UNKNOWN;
            if (bVar3 || bVar2) {
              bVar2 = (State >> 0xd & 1) == 0;
              bVar3 = (State & ~RESOURCE_STATE_RESOLVE_DEST) == RESOURCE_STATE_UNKNOWN;
              if (bVar3 || bVar2) {
                bVar2 = (State >> 0x10 & 1) == 0;
                bVar3 = (State & ~RESOURCE_STATE_PRESENT) == RESOURCE_STATE_UNKNOWN;
                if (bVar3 || bVar2) {
                  bVar2 = (State >> 0x12 & 1) == 0;
                  bVar3 = (State & ~RESOURCE_STATE_BUILD_AS_WRITE) == RESOURCE_STATE_UNKNOWN;
                  if (bVar3 || bVar2) {
                    bVar2 = (State >> 0x13 & 1) == 0;
                    bVar3 = (State & ~RESOURCE_STATE_RAY_TRACING) == RESOURCE_STATE_UNKNOWN;
                    if (bVar3 || bVar2) {
                      bVar2 = (State >> 0x15 & 1) == 0;
                      bVar3 = (State & ~RESOURCE_STATE_MAX_BIT) == RESOURCE_STATE_UNKNOWN;
                      State_00 = (RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2);
                      if (bVar3 || bVar2) {
                        if (IsTexture) {
                          if ((State & (RESOURCE_STATE_INDIRECT_ARGUMENT|RESOURCE_STATE_STREAM_OUT|
                                        RESOURCE_STATE_INDEX_BUFFER|RESOURCE_STATE_CONSTANT_BUFFER|
                                       RESOURCE_STATE_VERTEX_BUFFER)) == RESOURCE_STATE_UNKNOWN) {
                            return true;
                          }
                          GetResourceStateString_abi_cxx11_(&local_28,this,State_00);
                          FormatString<char[7],std::__cxx11::string,char[202]>
                                    (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)
                                     " is invalid: states RESOURCE_STATE_VERTEX_BUFFER, RESOURCE_STATE_CONSTANT_BUFFER, RESOURCE_STATE_INDEX_BUFFER, RESOURCE_STATE_STREAM_OUT, RESOURCE_STATE_INDIRECT_ARGUMENT are not applicable to textures"
                                     ,(char (*) [202])in_R8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_28._M_dataplus._M_p != &local_28.field_2) {
                            operator_delete(local_28._M_dataplus._M_p,
                                            local_28.field_2._M_allocated_capacity + 1);
                          }
                          if (DebugMessageCallback != (undefined *)0x0) {
                            (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                          }
                        }
                        else {
                          if ((State & (RESOURCE_STATE_MAX_BIT|RESOURCE_STATE_PRESENT|
                                        RESOURCE_STATE_INPUT_ATTACHMENT|
                                        RESOURCE_STATE_RESOLVE_SOURCE|RESOURCE_STATE_RESOLVE_DEST|
                                        RESOURCE_STATE_DEPTH_READ|RESOURCE_STATE_DEPTH_WRITE|
                                       RESOURCE_STATE_RENDER_TARGET)) == RESOURCE_STATE_UNKNOWN) {
                            return true;
                          }
                          GetResourceStateString_abi_cxx11_(&local_28,this,State_00);
                          FormatString<char[7],std::__cxx11::string,char[280]>
                                    (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)
                                     " is invalid: states RESOURCE_STATE_RENDER_TARGET, RESOURCE_STATE_DEPTH_WRITE, RESOURCE_STATE_DEPTH_READ, RESOURCE_STATE_RESOLVE_SOURCE, RESOURCE_STATE_RESOLVE_DEST, RESOURCE_STATE_PRESENT, RESOURCE_STATE_INPUT_ATTACHMENT, RESOURCE_STATE_SHADING_RATE are not applicable to buffers"
                                     ,in_R8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_28._M_dataplus._M_p != &local_28.field_2) {
                            operator_delete(local_28._M_dataplus._M_p,
                                            local_28.field_2._M_allocated_capacity + 1);
                          }
                          if (DebugMessageCallback != (undefined *)0x0) {
                            (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                          }
                        }
                      }
                      else {
                        GetResourceStateString_abi_cxx11_(&local_28,this,State_00);
                        FormatString<char[7],std::__cxx11::string,char[80]>
                                  (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)
                                   " is invalid: RESOURCE_STATE_SHADING_RATE can\'t be combined with any other state"
                                   ,(char (*) [80])in_R8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_28._M_dataplus._M_p != &local_28.field_2) {
                          operator_delete(local_28._M_dataplus._M_p,
                                          local_28.field_2._M_allocated_capacity + 1);
                        }
                        if (DebugMessageCallback != (undefined *)0x0) {
                          (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                        }
                      }
                    }
                    else {
                      GetResourceStateString_abi_cxx11_
                                (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
                      FormatString<char[7],std::__cxx11::string,char[79]>
                                (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)
                                 " is invalid: RESOURCE_STATE_RAY_TRACING can\'t be combined with any other state"
                                 ,(char (*) [79])in_R8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_28._M_dataplus._M_p != &local_28.field_2) {
                        operator_delete(local_28._M_dataplus._M_p,
                                        local_28.field_2._M_allocated_capacity + 1);
                      }
                      if (DebugMessageCallback != (undefined *)0x0) {
                        (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                      }
                    }
                  }
                  else {
                    GetResourceStateString_abi_cxx11_
                              (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
                    FormatString<char[7],std::__cxx11::string,char[82]>
                              (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               " is invalid: RESOURCE_STATE_BUILD_AS_WRITE can\'t be combined with any other state"
                               ,(char (*) [82])in_R8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_28._M_dataplus._M_p != &local_28.field_2) {
                      operator_delete(local_28._M_dataplus._M_p,
                                      local_28.field_2._M_allocated_capacity + 1);
                    }
                    if (DebugMessageCallback != (undefined *)0x0) {
                      (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                    }
                  }
                }
                else {
                  GetResourceStateString_abi_cxx11_
                            (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
                  FormatString<char[7],std::__cxx11::string,char[75]>
                            (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             " is invalid: RESOURCE_STATE_PRESENT can\'t be combined with any other state"
                             ,(char (*) [75])in_R8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_28._M_dataplus._M_p != &local_28.field_2) {
                    operator_delete(local_28._M_dataplus._M_p,
                                    local_28.field_2._M_allocated_capacity + 1);
                  }
                  if (DebugMessageCallback != (undefined *)0x0) {
                    (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                  }
                }
              }
              else {
                GetResourceStateString_abi_cxx11_
                          (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
                FormatString<char[7],std::__cxx11::string,char[80]>
                          (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           " is invalid: RESOURCE_STATE_RESOLVE_DEST can\'t be combined with any other state"
                           ,(char (*) [80])in_R8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_28._M_dataplus._M_p != &local_28.field_2) {
                  operator_delete(local_28._M_dataplus._M_p,
                                  local_28.field_2._M_allocated_capacity + 1);
                }
                if (DebugMessageCallback != (undefined *)0x0) {
                  (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
                }
              }
            }
            else {
              GetResourceStateString_abi_cxx11_
                        (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
              FormatString<char[7],std::__cxx11::string,char[77]>
                        (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         " is invalid: RESOURCE_STATE_COPY_DEST can\'t be combined with any other state"
                         ,(char (*) [77])in_R8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_28._M_dataplus._M_p != &local_28.field_2) {
                operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1
                               );
              }
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
              }
            }
          }
          else {
            GetResourceStateString_abi_cxx11_
                      (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
            FormatString<char[7],std::__cxx11::string,char[79]>
                      (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       " is invalid: RESOURCE_STATE_DEPTH_WRITE can\'t be combined with any other state"
                       ,(char (*) [79])in_R8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_28._M_dataplus._M_p != &local_28.field_2) {
              operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
            }
          }
        }
        else {
          GetResourceStateString_abi_cxx11_
                    (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
          FormatString<char[7],std::__cxx11::string,char[81]>
                    (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     " is invalid: RESOURCE_STATE_RENDER_TARGET can\'t be combined with any other state"
                     ,(char (*) [81])in_R8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_28._M_dataplus._M_p != &local_28.field_2) {
            operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
          }
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
          }
        }
      }
      else {
        GetResourceStateString_abi_cxx11_
                  (&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2));
        FormatString<char[7],std::__cxx11::string,char[84]>
                  (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " is invalid: RESOURCE_STATE_UNORDERED_ACCESS can\'t be combined with any other state"
                   ,(char (*) [84])in_R8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_28._M_dataplus._M_p != &local_28.field_2) {
          operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
        }
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
        }
      }
    }
    else {
      GetResourceStateString_abi_cxx11_
                (&local_28,this,
                 (RESOURCE_STATE)CONCAT71(uVar1,State < RESOURCE_STATE_VERTEX_BUFFER || bVar2));
      FormatString<char[7],std::__cxx11::string,char[77]>
                (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_UNDEFINED can\'t be combined with any other state",
                 (char (*) [77])in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
      }
    }
  }
  else {
    GetResourceStateString_abi_cxx11_(&local_28,this,(RESOURCE_STATE)CONCAT71(uVar1,bVar3 || bVar2))
    ;
    FormatString<char[7],std::__cxx11::string,char[74]>
              (&local_48,(Diligent *)"State ",(char (*) [7])&local_28,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " is invalid: RESOURCE_STATE_COMMON can\'t be combined with any other state",
               (char (*) [74])in_R8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool VerifyResourceStates(RESOURCE_STATE State, bool IsTexture)
{
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update this function to handle the new resource state");

    // clang-format off
#define VERIFY_EXCLUSIVE_STATE(ExclusiveState)\
if ( (State & ExclusiveState) != 0 && (State & ~ExclusiveState) != 0 )\
{\
    LOG_ERROR_MESSAGE("State ", GetResourceStateString(State), " is invalid: " #ExclusiveState " can't be combined with any other state");\
    return false;\
}

    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_COMMON);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_UNDEFINED);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_UNORDERED_ACCESS);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_RENDER_TARGET);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_DEPTH_WRITE);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_COPY_DEST);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_RESOLVE_DEST);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_PRESENT);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_BUILD_AS_WRITE);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_RAY_TRACING);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_SHADING_RATE);
#undef VERIFY_EXCLUSIVE_STATE
    // clang-format on

    if (IsTexture)
    {
        // clang-format off
        if (State &
            (RESOURCE_STATE_VERTEX_BUFFER   |
             RESOURCE_STATE_CONSTANT_BUFFER |
             RESOURCE_STATE_INDEX_BUFFER    |
             RESOURCE_STATE_STREAM_OUT      |
             RESOURCE_STATE_INDIRECT_ARGUMENT))
        {
            LOG_ERROR_MESSAGE("State ", GetResourceStateString(State), " is invalid: states RESOURCE_STATE_VERTEX_BUFFER, "
                              "RESOURCE_STATE_CONSTANT_BUFFER, RESOURCE_STATE_INDEX_BUFFER, RESOURCE_STATE_STREAM_OUT, "
                              "RESOURCE_STATE_INDIRECT_ARGUMENT are not applicable to textures");
            return false;
        }
        // clang-format on
    }
    else
    {
        // clang-format off
        if (State &
            (RESOURCE_STATE_RENDER_TARGET  |
             RESOURCE_STATE_DEPTH_WRITE    |
             RESOURCE_STATE_DEPTH_READ     |
             RESOURCE_STATE_RESOLVE_SOURCE |
             RESOURCE_STATE_RESOLVE_DEST   |
             RESOURCE_STATE_PRESENT        |
             RESOURCE_STATE_SHADING_RATE   |
             RESOURCE_STATE_INPUT_ATTACHMENT))
        {
            LOG_ERROR_MESSAGE("State ", GetResourceStateString(State), " is invalid: states RESOURCE_STATE_RENDER_TARGET, "
                              "RESOURCE_STATE_DEPTH_WRITE, RESOURCE_STATE_DEPTH_READ, RESOURCE_STATE_RESOLVE_SOURCE, "
                              "RESOURCE_STATE_RESOLVE_DEST, RESOURCE_STATE_PRESENT, RESOURCE_STATE_INPUT_ATTACHMENT, RESOURCE_STATE_SHADING_RATE "
                              "are not applicable to buffers");
            return false;
        }
        // clang-format on
    }

    return true;
}